

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faces_kba.h
# Opt level: O3

Pointer * Faces_facexz_step(Faces *faces,int step)

{
  Pointer *pPVar1;
  uint i;
  
  if (faces == (Faces *)0x0) {
    __assert_fail("faces != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/faces_kba.h"
                  ,0x7e,"Pointer *Faces_facexz_step(Faces *, int)");
  }
  if (-2 < step) {
    if (faces->is_face_comm_async == 0) {
      i = 0;
    }
    else {
      i = (step + 3U) % 3;
    }
    pPVar1 = Faces_facexz(faces,i);
    return pPVar1;
  }
  __assert_fail("step >= -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/faces_kba.h"
                ,0x7f,"Pointer *Faces_facexz_step(Faces *, int)");
}

Assistant:

static Pointer* Faces_facexz_step( Faces* faces, int step )
{
  Assert( faces != NULL );
  Assert( step >= -1 );

  return Faces_facexz( faces,
                       Faces_is_face_comm_async( faces ) ? (step+3)%3 : 0 );
}